

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_update(sha256_t *p,uchar *data,size_t size)

{
  undefined1 *puVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint uVar2;
  undefined1 *in_RSI;
  long in_RDI;
  uint32_t curBufferPos;
  uint local_1c;
  long local_18;
  undefined1 *local_10;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  local_1c = (uint)*(undefined8 *)(in_RDI + 0x20) & 0x3f;
  local_10 = in_RSI;
  while (local_18 != 0) {
    puVar1 = local_10 + 1;
    uVar2 = local_1c + 1;
    *(undefined1 *)(in_RDI + 0x28 + (ulong)local_1c) = *local_10;
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
    local_18 = local_18 + -1;
    local_1c = uVar2;
    local_10 = puVar1;
    if (uVar2 == 0x40) {
      local_1c = 0;
      sha256_write_byte_block(p);
    }
  }
  return;
}

Assistant:

void
sha256_update(sha256_t *p, const unsigned char *data, size_t size)
{
  uint32_t curBufferPos = (uint32_t)p->count & 0x3F;
  while (size > 0)
  {
    p->buffer[curBufferPos++] = *data++;
    p->count++;
    size--;
    if (curBufferPos == 64)
    {
      curBufferPos = 0;
      sha256_write_byte_block(p);
    }
  }
}